

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

reference __thiscall
QVLABase<QRhiBufferData>::emplace_back_impl<QRhiBufferData>
          (QVLABase<QRhiBufferData> *this,qsizetype prealloc,void *array,QRhiBufferData *args)

{
  reference pvVar1;
  long lVar2;
  QRhiBufferDataPrivate *pQVar3;
  long aalloc;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    aalloc = lVar2 + 1;
    if (lVar2 + 1 < lVar2 * 2) {
      aalloc = lVar2 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar2,aalloc);
  }
  lVar2 = (this->super_QVLABaseBase).s;
  pvVar1 = (reference)((long)(this->super_QVLABaseBase).ptr + lVar2 * 8);
  pQVar3 = args->d;
  pvVar1->d = pQVar3;
  if (pQVar3 != (QRhiBufferDataPrivate *)0x0) {
    pQVar3->ref = pQVar3->ref + 1;
  }
  (this->super_QVLABaseBase).s = lVar2 + 1;
  return pvVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }